

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O0

int spotrf_(char *uplo,integer *n,real *a,integer *lda,integer *info)

{
  bool bVar1;
  logical lVar2;
  integer local_88;
  integer local_80;
  real local_78;
  int local_70;
  int local_6c;
  integer i__4;
  integer i__3;
  integer i__2;
  integer i__1;
  integer a_offset;
  integer a_dim1;
  integer *info_local;
  integer *lda_local;
  real *a_local;
  integer *n_local;
  char *uplo_local;
  
  i__1 = *lda;
  i__2 = i__1 + 1;
  lda_local = (integer *)(a + -(long)i__2);
  *info = 0;
  _a_offset = info;
  info_local = lda;
  a_local = (real *)n;
  n_local = (integer *)uplo;
  spotrf_::upper = lsame_(uplo,"U");
  if ((spotrf_::upper == 0) && (lVar2 = lsame_((char *)n_local,"L"), lVar2 == 0)) {
    *_a_offset = -1;
  }
  else if ((int)*a_local < 0) {
    *_a_offset = -2;
  }
  else {
    if ((int)*a_local < 2) {
      local_78 = 1.4013e-45;
    }
    else {
      local_78 = *a_local;
    }
    if (*info_local < (int)local_78) {
      *_a_offset = -4;
    }
  }
  if (*_a_offset == 0) {
    if (*a_local != 0.0) {
      spotrf_::nb = ilaenv_(&c__1,"SPOTRF",(char *)n_local,(integer *)a_local,&c_n1,&c_n1,&c_n1,6,1)
      ;
      if ((spotrf_::nb < 2) || ((int)*a_local <= spotrf_::nb)) {
        spotf2_((char *)n_local,(integer *)a_local,(real *)(lda_local + i__2),info_local,_a_offset);
      }
      else {
        if (spotrf_::upper == 0) {
          i__4 = (integer)*a_local;
          spotrf_::j = 1;
          i__3 = spotrf_::nb;
          while( true ) {
            if (i__3 < 0) {
              bVar1 = i__4 <= spotrf_::j;
            }
            else {
              bVar1 = spotrf_::j <= i__4;
            }
            if (!bVar1) {
              return 0;
            }
            local_70 = ((int)*a_local - spotrf_::j) + 1;
            local_88 = local_70;
            if (spotrf_::nb <= local_70) {
              local_88 = spotrf_::nb;
            }
            spotrf_::jb = local_88;
            local_6c = spotrf_::j + -1;
            ssyrk_("Lower","No transpose",&spotrf_::jb,&local_6c,&c_b181,
                   (real *)(lda_local + (spotrf_::j + i__1)),info_local,&c_b164,
                   (real *)(lda_local + (spotrf_::j + spotrf_::j * i__1)),info_local);
            spotf2_("Lower",&spotrf_::jb,(real *)(lda_local + (spotrf_::j + spotrf_::j * i__1)),
                    info_local,_a_offset);
            if (*_a_offset != 0) break;
            if (spotrf_::j + spotrf_::jb <= (int)*a_local) {
              local_6c = (((int)*a_local - spotrf_::j) - spotrf_::jb) + 1;
              local_70 = spotrf_::j + -1;
              sgemm_("No transpose","Transpose",&local_6c,&spotrf_::jb,&local_70,&c_b181,
                     (real *)(lda_local + (spotrf_::j + spotrf_::jb + i__1)),info_local,
                     (real *)(lda_local + (spotrf_::j + i__1)),info_local,&c_b164,
                     (real *)(lda_local + (spotrf_::j + spotrf_::jb + spotrf_::j * i__1)),info_local
                    );
              local_6c = (((int)*a_local - spotrf_::j) - spotrf_::jb) + 1;
              strsm_("Right","Lower","Transpose","Non-unit",&local_6c,&spotrf_::jb,&c_b164,
                     (real *)(lda_local + (spotrf_::j + spotrf_::j * i__1)),info_local,
                     (real *)(lda_local + (spotrf_::j + spotrf_::jb + spotrf_::j * i__1)),info_local
                    );
            }
            spotrf_::j = i__3 + spotrf_::j;
          }
        }
        else {
          i__3 = (integer)*a_local;
          spotrf_::j = 1;
          i__4 = spotrf_::nb;
          while( true ) {
            if (i__4 < 0) {
              bVar1 = i__3 <= spotrf_::j;
            }
            else {
              bVar1 = spotrf_::j <= i__3;
            }
            if (!bVar1) {
              return 0;
            }
            local_70 = ((int)*a_local - spotrf_::j) + 1;
            local_80 = local_70;
            if (spotrf_::nb <= local_70) {
              local_80 = spotrf_::nb;
            }
            spotrf_::jb = local_80;
            local_6c = spotrf_::j + -1;
            ssyrk_("Upper","Transpose",&spotrf_::jb,&local_6c,&c_b181,
                   (real *)(lda_local + (spotrf_::j * i__1 + 1)),info_local,&c_b164,
                   (real *)(lda_local + (spotrf_::j + spotrf_::j * i__1)),info_local);
            spotf2_("Upper",&spotrf_::jb,(real *)(lda_local + (spotrf_::j + spotrf_::j * i__1)),
                    info_local,_a_offset);
            if (*_a_offset != 0) break;
            if (spotrf_::j + spotrf_::jb <= (int)*a_local) {
              local_6c = (((int)*a_local - spotrf_::j) - spotrf_::jb) + 1;
              local_70 = spotrf_::j + -1;
              sgemm_("Transpose","No transpose",&spotrf_::jb,&local_6c,&local_70,&c_b181,
                     (real *)(lda_local + (spotrf_::j * i__1 + 1)),info_local,
                     (real *)(lda_local + ((spotrf_::j + spotrf_::jb) * i__1 + 1)),info_local,
                     &c_b164,(real *)(lda_local + (spotrf_::j + (spotrf_::j + spotrf_::jb) * i__1)),
                     info_local);
              local_6c = (((int)*a_local - spotrf_::j) - spotrf_::jb) + 1;
              strsm_("Left","Upper","Transpose","Non-unit",&spotrf_::jb,&local_6c,&c_b164,
                     (real *)(lda_local + (spotrf_::j + spotrf_::j * i__1)),info_local,
                     (real *)(lda_local + (spotrf_::j + (spotrf_::j + spotrf_::jb) * i__1)),
                     info_local);
            }
            spotrf_::j = i__4 + spotrf_::j;
          }
        }
        *_a_offset = *_a_offset + spotrf_::j + -1;
      }
    }
  }
  else {
    i__3 = -*_a_offset;
    xerbla_("SPOTRF",&i__3);
  }
  return 0;
}

Assistant:

int spotrf_(char *uplo, integer *n, real *a, integer *lda,
	integer *info)
{
    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
    static integer j, jb, nb;
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int sgemm_(char *, char *, integer *, integer *,
	    integer *, real *, real *, integer *, real *, integer *, real *,
	    real *, integer *);
    static logical upper;
    extern /* Subroutine */ int strsm_(char *, char *, char *, char *,
	    integer *, integer *, real *, real *, integer *, real *, integer *
	    ), ssyrk_(char *, char *, integer
	    *, integer *, real *, real *, integer *, real *, real *, integer *
	    ), spotf2_(char *, integer *, real *, integer *,
	    integer *), xerbla_(char *, integer *);
    extern integer ilaenv_(integer *, char *, char *, integer *, integer *,
	    integer *, integer *, ftnlen, ftnlen);


/*
    -- LAPACK routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       March 31, 1993


    Purpose
    =======

    SPOTRF computes the Cholesky factorization of a real symmetric
    positive definite matrix A.

    The factorization has the form
       A = U**T * U,  if UPLO = 'U', or
       A = L  * L**T,  if UPLO = 'L',
    where U is an upper triangular matrix and L is lower triangular.

    This is the block version of the algorithm, calling Level 3 BLAS.

    Arguments
    =========

    UPLO    (input) CHARACTER*1
            = 'U':  Upper triangle of A is stored;
            = 'L':  Lower triangle of A is stored.

    N       (input) INTEGER
            The order of the matrix A.  N >= 0.

    A       (input/output) REAL array, dimension (LDA,N)
            On entry, the symmetric matrix A.  If UPLO = 'U', the leading
            N-by-N upper triangular part of A contains the upper
            triangular part of the matrix A, and the strictly lower
            triangular part of A is not referenced.  If UPLO = 'L', the
            leading N-by-N lower triangular part of A contains the lower
            triangular part of the matrix A, and the strictly upper
            triangular part of A is not referenced.

            On exit, if INFO = 0, the factor U or L from the Cholesky
            factorization A = U**T*U or A = L*L**T.

    LDA     (input) INTEGER
            The leading dimension of the array A.  LDA >= max(1,N).

    INFO    (output) INTEGER
            = 0:  successful exit
            < 0:  if INFO = -i, the i-th argument had an illegal value
            > 0:  if INFO = i, the leading minor of order i is not
                  positive definite, and the factorization could not be
                  completed.

    =====================================================================


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;

    /* Function Body */
    *info = 0;
    upper = lsame_(uplo, "U");
    if (! upper && ! lsame_(uplo, "L")) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*lda < max(1,*n)) {
	*info = -4;
    }
    if (*info != 0) {
	i__1 = -(*info);
	xerbla_("SPOTRF", &i__1);
	return 0;
    }

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

/*     Determine the block size for this environment. */

    nb = ilaenv_(&c__1, "SPOTRF", uplo, n, &c_n1, &c_n1, &c_n1, (ftnlen)6, (
	    ftnlen)1);
    if (nb <= 1 || nb >= *n) {

/*        Use unblocked code. */

	spotf2_(uplo, n, &a[a_offset], lda, info);
    } else {

/*        Use blocked code. */

	if (upper) {

/*           Compute the Cholesky factorization A = U'*U. */

	    i__1 = *n;
	    i__2 = nb;
	    for (j = 1; i__2 < 0 ? j >= i__1 : j <= i__1; j += i__2) {

/*
                Update and factorize the current diagonal block and test
                for non-positive-definiteness.

   Computing MIN
*/
		i__3 = nb, i__4 = *n - j + 1;
		jb = min(i__3,i__4);
		i__3 = j - 1;
		ssyrk_("Upper", "Transpose", &jb, &i__3, &c_b181, &a[j *
			a_dim1 + 1], lda, &c_b164, &a[j + j * a_dim1], lda);
		spotf2_("Upper", &jb, &a[j + j * a_dim1], lda, info);
		if (*info != 0) {
		    goto L30;
		}
		if (j + jb <= *n) {

/*                 Compute the current block row. */

		    i__3 = *n - j - jb + 1;
		    i__4 = j - 1;
		    sgemm_("Transpose", "No transpose", &jb, &i__3, &i__4, &
			    c_b181, &a[j * a_dim1 + 1], lda, &a[(j + jb) *
			    a_dim1 + 1], lda, &c_b164, &a[j + (j + jb) *
			    a_dim1], lda);
		    i__3 = *n - j - jb + 1;
		    strsm_("Left", "Upper", "Transpose", "Non-unit", &jb, &
			    i__3, &c_b164, &a[j + j * a_dim1], lda, &a[j + (j
			    + jb) * a_dim1], lda);
		}
/* L10: */
	    }

	} else {

/*           Compute the Cholesky factorization A = L*L'. */

	    i__2 = *n;
	    i__1 = nb;
	    for (j = 1; i__1 < 0 ? j >= i__2 : j <= i__2; j += i__1) {

/*
                Update and factorize the current diagonal block and test
                for non-positive-definiteness.

   Computing MIN
*/
		i__3 = nb, i__4 = *n - j + 1;
		jb = min(i__3,i__4);
		i__3 = j - 1;
		ssyrk_("Lower", "No transpose", &jb, &i__3, &c_b181, &a[j +
			a_dim1], lda, &c_b164, &a[j + j * a_dim1], lda);
		spotf2_("Lower", &jb, &a[j + j * a_dim1], lda, info);
		if (*info != 0) {
		    goto L30;
		}
		if (j + jb <= *n) {

/*                 Compute the current block column. */

		    i__3 = *n - j - jb + 1;
		    i__4 = j - 1;
		    sgemm_("No transpose", "Transpose", &i__3, &jb, &i__4, &
			    c_b181, &a[j + jb + a_dim1], lda, &a[j + a_dim1],
			    lda, &c_b164, &a[j + jb + j * a_dim1], lda);
		    i__3 = *n - j - jb + 1;
		    strsm_("Right", "Lower", "Transpose", "Non-unit", &i__3, &
			    jb, &c_b164, &a[j + j * a_dim1], lda, &a[j + jb +
			    j * a_dim1], lda);
		}
/* L20: */
	    }
	}
    }
    goto L40;

L30:
    *info = *info + j - 1;

L40:
    return 0;

/*     End of SPOTRF */

}